

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O1

void idx2::WriteChunk(idx2_file *Idx2,encode_data *E,channel *C,i8 Level,i8 Subband,i16 BitPlane)

{
  int iVar1;
  anon_union_8_2_2df48d06_for_stref_0 *Src;
  bitstream *Bs;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  u64 *puVar11;
  ulong *puVar12;
  i64 *piVar13;
  bool bVar14;
  array<unsigned_long> *Array;
  int iVar15;
  uint uVar16;
  byte *pbVar17;
  FILE *__s;
  size_t sVar18;
  byte bVar19;
  FILE *Key;
  uint uVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  undefined8 in_XMM0_Qa;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM4_Qb;
  stref sVar28;
  iterator ChunkMetaIt;
  file_id FileId;
  chunk_meta_info Cm;
  anon_union_8_2_2df48d06_for_stref_0 local_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  long local_c0;
  long local_b8;
  anon_union_8_2_2df48d06_for_stref_0 local_b0 [2];
  undefined1 local_a0 [8];
  chunk_meta_info local_98;
  
  iVar15 = (C->BrickDeltasStream).BitPos;
  iVar1 = iVar15 + 7;
  iVar15 = iVar15 + 0xe;
  if (-1 < iVar1) {
    iVar15 = iVar1;
  }
  pbVar17 = (C->BrickDeltasStream).BitPtr +
            ((long)(iVar15 >> 3) - (long)(C->BrickDeltasStream).Stream.Data);
  auVar25._0_8_ = (double)(long)pbVar17;
  auVar25._8_8_ = in_XMM0_Qa;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _ZN4idx2L15BrickDeltasStatE_0;
  auVar2 = vminsd_avx(auVar25,auVar2);
  _ZN4idx2L15BrickDeltasStatE_0 = auVar2._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _ZN4idx2L15BrickDeltasStatE_1;
  auVar2 = vmaxsd_avx(auVar25,auVar3);
  _ZN4idx2L15BrickDeltasStatE_1 = auVar2._0_8_;
  _ZN4idx2L15BrickDeltasStatE_2 = auVar25._0_8_ + _ZN4idx2L15BrickDeltasStatE_2;
  _ZN4idx2L15BrickDeltasStatE_3 = _ZN4idx2L15BrickDeltasStatE_3 + 1;
  _ZN4idx2L15BrickDeltasStatE_4 = auVar25._0_8_ * auVar25._0_8_ + _ZN4idx2L15BrickDeltasStatE_4;
  iVar15 = (C->BrickSizeStream).BitPos;
  iVar1 = iVar15 + 7;
  iVar15 = iVar15 + 0xe;
  if (-1 < iVar1) {
    iVar15 = iVar1;
  }
  pbVar21 = (C->BrickSizeStream).BitPtr +
            ((long)(iVar15 >> 3) - (long)(C->BrickSizeStream).Stream.Data);
  auVar26._0_8_ = (double)(long)pbVar21;
  auVar26._8_8_ = in_XMM2_Qa;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = _ZN4idx2L14BrickSizesStatE_0;
  auVar3 = vminsd_avx(auVar26,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = _ZN4idx2L14BrickSizesStatE_1;
  auVar2 = vmaxsd_avx(auVar26,auVar5);
  _ZN4idx2L14BrickSizesStatE_2 = auVar26._0_8_ + _ZN4idx2L14BrickSizesStatE_2;
  _ZN4idx2L14BrickSizesStatE_0 = auVar3._0_8_;
  _ZN4idx2L14BrickSizesStatE_3 = _ZN4idx2L14BrickSizesStatE_3 + 1;
  _ZN4idx2L14BrickSizesStatE_1 = auVar2._0_8_;
  _ZN4idx2L14BrickSizesStatE_4 = auVar26._0_8_ * auVar26._0_8_ + _ZN4idx2L14BrickSizesStatE_4;
  iVar15 = (C->BrickStream).BitPos;
  iVar1 = iVar15 + 7;
  iVar15 = iVar15 + 0xe;
  if (-1 < iVar1) {
    iVar15 = iVar1;
  }
  lVar8 = (E->ChunkStream).Stream.Bytes;
  pbVar9 = (C->BrickStream).BitPtr;
  pbVar10 = (C->BrickStream).Stream.Data;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  for (lVar24 = lVar8;
      lVar24 <= (long)(pbVar9 + (long)(pbVar21 + (long)pbVar17 +
                                      ((long)(iVar15 >> 3) - (long)pbVar10) + 0x48));
      lVar24 = (lVar24 * 3) / 2 + 8) {
  }
  Bs = &E->ChunkStream;
  if ((lVar8 < lVar24) && (lVar8 < lVar24 + 8)) {
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    local_98.Addrs.Buffer.Data = (byte *)0x0;
    local_98.Addrs.Buffer.Bytes = 0;
    local_98.Addrs.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    AllocBuf((buffer *)(local_a0 + 8),lVar24 + 8,(E->ChunkStream).Stream.Alloc);
    iVar15 = (E->ChunkStream).BitPos;
    iVar1 = iVar15 + 7;
    iVar15 = iVar15 + 0xe;
    if (-1 < iVar1) {
      iVar15 = iVar1;
    }
    MemCopy(&Bs->Stream,(buffer *)(local_a0 + 8),
            (u64)((E->ChunkStream).BitPtr +
                 ((long)(iVar15 >> 3) - (long)(E->ChunkStream).Stream.Data)));
    (E->ChunkStream).BitPtr =
         local_98.Addrs.Buffer.Data +
         ((long)(E->ChunkStream).BitPtr - (long)(E->ChunkStream).Stream.Data);
    DeallocBuf(&Bs->Stream);
    (E->ChunkStream).Stream.Alloc = local_98.Addrs.Buffer.Alloc;
    (Bs->Stream).Data = local_98.Addrs.Buffer.Data;
    (E->ChunkStream).Stream.Bytes = local_98.Addrs.Buffer.Bytes;
  }
  uVar16 = (E->ChunkStream).BitPos;
  uVar23 = (long)C->NBricks;
  do {
    if (0x38 < (int)uVar16) {
      puVar11 = (u64 *)(E->ChunkStream).BitPtr;
      *puVar11 = (E->ChunkStream).BitBuf;
      (E->ChunkStream).BitBuf = ((E->ChunkStream).BitBuf >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f)
      ;
      (E->ChunkStream).BitPtr = (byte *)((ulong)(uVar16 >> 3) + (long)puVar11);
      uVar16 = uVar16 & 7;
    }
    uVar22 = (ulong)((uint)uVar23 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar16 & 0x3f) |
             (E->ChunkStream).BitBuf;
    (E->ChunkStream).BitBuf = uVar22;
    uVar20 = uVar16 + 7;
    if (0x37 < (int)uVar16) {
      puVar12 = (ulong *)(E->ChunkStream).BitPtr;
      *puVar12 = uVar22;
      if (7 < uVar20) {
        (E->ChunkStream).BitBuf =
             ((E->ChunkStream).BitBuf >> 1) >> (((byte)uVar20 & 0xf8) - 1 & 0x3f);
      }
      (E->ChunkStream).BitPtr = (byte *)((long)puVar12 + (ulong)(uVar20 >> 3));
      uVar20 = uVar20 & 7;
    }
    puVar11 = &(E->ChunkStream).BitBuf;
    *puVar11 = *puVar11 |
               (ulong)(0x7f < uVar23 & (uint)bitstream::Masks.Arr[1]) << ((byte)uVar20 & 0x3f);
    uVar16 = uVar20 + 1;
    bVar14 = 0x7f < uVar23;
    uVar23 = uVar23 >> 7;
  } while (bVar14);
  (E->ChunkStream).BitPos = uVar16;
  WriteStream(Bs,&C->BrickDeltasStream);
  WriteStream(Bs,&C->BrickSizeStream);
  WriteStream(Bs,&C->BrickStream);
  puVar11 = (u64 *)(E->ChunkStream).BitPtr;
  *puVar11 = (E->ChunkStream).BitBuf;
  uVar16 = (E->ChunkStream).BitPos;
  if (0 < (int)uVar16 >> 3) {
    (E->ChunkStream).BitBuf = ((E->ChunkStream).BitBuf >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f);
  }
  pbVar17 = (byte *)((long)puVar11 + (long)((int)uVar16 >> 3));
  (E->ChunkStream).BitPtr = pbVar17;
  (E->ChunkStream).BitPos = uVar16 & 7;
  auVar27._0_8_ =
       (double)(long)(pbVar17 +
                     ((ulong)((uVar16 & 7) + 7 >> 3) - (long)(E->ChunkStream).Stream.Data));
  auVar27._8_8_ = in_XMM4_Qb;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_0;
  auVar3 = vminsd_avx(auVar27,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_1;
  auVar2 = vmaxsd_avx(auVar27,auVar7);
  _ZN4idx2L18BitPlaneChunksStatE_2 = auVar27._0_8_ + _ZN4idx2L18BitPlaneChunksStatE_2;
  _ZN4idx2L18BitPlaneChunksStatE_0 = auVar3._0_8_;
  _ZN4idx2L18BitPlaneChunksStatE_3 = _ZN4idx2L18BitPlaneChunksStatE_3 + 1;
  _ZN4idx2L18BitPlaneChunksStatE_1 = auVar2._0_8_;
  _ZN4idx2L18BitPlaneChunksStatE_4 =
       auVar27._0_8_ * auVar27._0_8_ + _ZN4idx2L18BitPlaneChunksStatE_4;
  pbVar17 = (C->BrickSizeStream).Stream.Data;
  (C->BrickDeltasStream).BitPtr = (C->BrickDeltasStream).Stream.Data;
  (C->BrickDeltasStream).BitPos = 0;
  (C->BrickDeltasStream).BitBuf = 0;
  (C->BrickSizeStream).BitPtr = pbVar17;
  (C->BrickSizeStream).BitPos = 0;
  (C->BrickSizeStream).BitBuf = 0;
  (C->BrickStream).BitPtr = (C->BrickStream).Stream.Data;
  (C->BrickStream).BitPos = 0;
  (C->BrickStream).BitBuf = 0;
  ConstructFilePath((file_id *)local_b0,Idx2,C->LastBrick,Level,Subband,BitPlane);
  __s = fopen(local_b0[0].Ptr,"ab");
  if (__s == (FILE *)0x0) {
    local_d0.Ptr = local_b0[0].Ptr;
    sVar18 = strlen(local_b0[0].Ptr);
    local_c8 = (undefined4)sVar18;
    sVar28 = GetParentPath((stref *)&local_d0);
    local_98.Addrs.Buffer.Data = (byte *)sVar28.field_0;
    local_98.Addrs.Buffer.Bytes = CONCAT44(local_98.Addrs.Buffer.Bytes._4_4_,sVar28.Size);
    CreateFullDir((stref *)(local_a0 + 8));
    __s = fopen(local_b0[0].Ptr,"ab");
  }
  pbVar17 = (E->ChunkStream).Stream.Data;
  iVar15 = (E->ChunkStream).BitPos;
  iVar1 = iVar15 + 7;
  iVar15 = iVar15 + 0xe;
  if (-1 < iVar1) {
    iVar15 = iVar1;
  }
  Key = __s;
  fwrite(pbVar17,(size_t)((E->ChunkStream).BitPtr + ((long)(iVar15 >> 3) - (long)pbVar17)),1,__s);
  Lookup<unsigned_long,idx2::chunk_meta_info>
            ((iterator *)&local_d0,(idx2 *)&E->ChunkMeta,
             (hash_table<unsigned_long,_idx2::chunk_meta_info> *)local_a0,(unsigned_long *)Key);
  if (*(char *)(*(long *)(local_c0 + 0x10) + local_b8) != '\x02') {
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    local_98.Addrs.Buffer.Data = (byte *)0x0;
    local_98.Addrs.Buffer.Bytes = 0;
    local_98.Addrs.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    local_98.Addrs.Size = 0;
    local_98.Addrs.Capacity = 0;
    local_98.Addrs.Alloc = (allocator *)&Mallocator()::Instance;
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    local_98.Sizes.Stream.Data = (byte *)0x0;
    local_98.Sizes.Stream.Bytes = 0;
    local_98.Sizes.Stream.Alloc = (allocator *)&Mallocator()::Instance;
    local_98.Sizes.BitPtr = (byte *)0x0;
    local_98.Sizes.BitBuf = 0;
    local_98.Sizes.BitPos = 0;
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    (*(code *)*Mallocator()::Instance)(&Mallocator()::Instance,&local_98.Sizes,0x88);
    local_98.Sizes.BitPtr = local_98.Sizes.Stream.Data;
    local_98.Sizes.BitPos = 0;
    local_98.Sizes.BitBuf = 0;
    Insert<unsigned_long,idx2::chunk_meta_info>
              ((iterator *)&local_d0,(unsigned_long *)local_a0,(chunk_meta_info *)(local_a0 + 8));
  }
  Array = (array<unsigned_long> *)CONCAT44(uStack_c4,local_c8);
  lVar8 = Array[1].Buffer.Bytes;
  iVar1 = *(int *)&Array[1].Alloc + 7;
  iVar15 = *(int *)&Array[1].Alloc + 0xe;
  if (-1 < iVar1) {
    iVar15 = iVar1;
  }
  for (lVar24 = lVar8;
      lVar24 <= (long)(iVar15 >> 3) + (Array[1].Size - (long)Array[1].Buffer.Data) + 0xc;
      lVar24 = (lVar24 * 3) / 2 + 8) {
  }
  if ((lVar8 < lVar24) && (lVar8 < lVar24 + 8)) {
    if (Mallocator()::Instance == '\0') {
      WriteChunk();
    }
    local_98.Addrs.Buffer.Data = (byte *)0x0;
    local_98.Addrs.Buffer.Bytes = 0;
    local_98.Addrs.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
    AllocBuf((buffer *)(local_a0 + 8),lVar24 + 8,Array[1].Buffer.Alloc);
    iVar1 = *(int *)&Array[1].Alloc + 7;
    iVar15 = *(int *)&Array[1].Alloc + 0xe;
    if (-1 < iVar1) {
      iVar15 = iVar1;
    }
    Src = (anon_union_8_2_2df48d06_for_stref_0 *)(Array + 1);
    MemCopy((buffer *)Src,(buffer *)(local_a0 + 8),
            (long)(iVar15 >> 3) + (Array[1].Size - (long)Array[1].Buffer.Data));
    Array[1].Size = (i64)(local_98.Addrs.Buffer.Data + (Array[1].Size - (long)Array[1].Buffer.Data))
    ;
    DeallocBuf((buffer *)Src);
    Array[1].Buffer.Alloc = local_98.Addrs.Buffer.Alloc;
    Src->Ptr = (str)local_98.Addrs.Buffer.Data;
    Array[1].Buffer.Bytes = local_98.Addrs.Buffer.Bytes;
  }
  iVar15 = (E->ChunkStream).BitPos;
  iVar1 = iVar15 + 7;
  iVar15 = iVar15 + 0xe;
  if (-1 < iVar1) {
    iVar15 = iVar1;
  }
  uVar16 = *(uint *)&Array[1].Alloc;
  pbVar17 = (E->ChunkStream).BitPtr + ((long)(iVar15 >> 3) - (long)(E->ChunkStream).Stream.Data);
  do {
    if (0x38 < (int)uVar16) {
      piVar13 = (i64 *)Array[1].Size;
      *piVar13 = Array[1].Capacity;
      Array[1].Capacity = ((ulong)Array[1].Capacity >> 1) >> (((byte)uVar16 & 0xf8) - 1 & 0x3f);
      Array[1].Size = (ulong)(uVar16 >> 3) + (long)piVar13;
      uVar16 = uVar16 & 7;
    }
    uVar23 = (ulong)((uint)pbVar17 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar16 & 0x3f)
             | Array[1].Capacity;
    Array[1].Capacity = uVar23;
    uVar20 = uVar16 + 7;
    if (0x37 < (int)uVar16) {
      puVar12 = (ulong *)Array[1].Size;
      *puVar12 = uVar23;
      if (7 < uVar20) {
        Array[1].Capacity = ((ulong)Array[1].Capacity >> 1) >> (((byte)uVar20 & 0xf8) - 1 & 0x3f);
      }
      Array[1].Size = (long)puVar12 + (ulong)(uVar20 >> 3);
      uVar20 = uVar20 & 7;
    }
    Array[1].Capacity =
         Array[1].Capacity |
         (ulong)((byte *)0x7f < pbVar17 & (uint)bitstream::Masks.Arr[1]) << ((byte)uVar20 & 0x3f);
    uVar16 = uVar20 + 1;
    bVar14 = (byte *)0x7f < pbVar17;
    pbVar17 = (byte *)((ulong)pbVar17 >> 7);
  } while (bVar14);
  *(uint *)&Array[1].Alloc = uVar16;
  if (Level < '\x10') {
    uVar23 = (ulong)(Idx2->BricksPerChunk).Arr[Level];
    lVar8 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    bVar19 = -(uVar23 == 0) | (byte)lVar8;
    uVar22 = C->LastBrick;
    if (Array->Capacity <= Array->Size) {
      GrowCapacity<unsigned_long>(Array,0);
    }
    pbVar17 = (Array->Buffer).Data;
    lVar8 = Array->Size;
    Array->Size = lVar8 + 1;
    *(ulong *)(pbVar17 + lVar8 * 8) =
         ((ulong)((ushort)BitPlane & 0xfff) |
         (long)((int)Subband << 0xc) + ((ulong)(byte)Level << 0x3c)) +
         (uVar22 >> ((1L << (bVar19 & 0x3f) != uVar23) + bVar19 & 0x3f)) * 0x40000;
    (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
    (E->ChunkStream).BitPos = 0;
    (E->ChunkStream).BitBuf = 0;
    if (__s != (FILE *)0x0) {
      fclose(__s);
    }
    return;
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
}

Assistant:

void
WriteChunk(const idx2_file& Idx2, encode_data* E, channel* C, i8 Level, i8 Subband, i16 BitPlane)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
    BrickSizesStat.Add((f64)Size(C->BrickSizeStream));      // brick sizes
    i64 ChunkSize =
      Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
    Rewind(&E->ChunkStream);
    GrowToAccomodate(&E->ChunkStream, ChunkSize);
    WriteVarByte(&E->ChunkStream, C->NBricks);
    WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
    WriteStream(&E->ChunkStream, &C->BrickSizeStream);
    WriteStream(&E->ChunkStream, &C->BrickStream);
    Flush(&E->ChunkStream);
    BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

    /* we are done with these, rewind */
    Rewind(&C->BrickDeltasStream);
    Rewind(&C->BrickSizeStream);
    Rewind(&C->BrickStream);

    u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
    buffer Buf = ToBuffer(E->ChunkStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkAddress))
      idx2_ExitIf(true, "Write chunk failed\n");
    Rewind(&E->ChunkStream);
    return;
  }
#endif

  BrickDeltasStat.Add((f64)Size(C->BrickDeltasStream)); // brick deltas
  BrickSizesStat.Add((f64)Size(C->BrickSizeStream));       // brick sizes
  i64 ChunkSize = Size(C->BrickDeltasStream) + Size(C->BrickSizeStream) + Size(C->BrickStream) + 64;
  Rewind(&E->ChunkStream);
  GrowToAccomodate(&E->ChunkStream, ChunkSize);
  WriteVarByte(&E->ChunkStream, C->NBricks);
  WriteStream(&E->ChunkStream, &C->BrickDeltasStream);
  WriteStream(&E->ChunkStream, &C->BrickSizeStream);
  WriteStream(&E->ChunkStream, &C->BrickStream);
  Flush(&E->ChunkStream);
  BitPlaneChunksStat.Add((f64)Size(E->ChunkStream));

  /* we are done with these, rewind */
  Rewind(&C->BrickDeltasStream);
  Rewind(&C->BrickSizeStream);
  Rewind(&C->BrickStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, C->LastBrick, Level, Subband, BitPlane);
  idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
  WriteBuffer(Fp, ToBuffer(E->ChunkStream));
  /* keep track of the chunk addresses and sizes */
  auto ChunkMetaIt = Lookup(E->ChunkMeta, FileId.Id);
  if (!ChunkMetaIt)
  {
    chunk_meta_info Cm;
    InitWrite(&Cm.Sizes, 128);
    Insert(&ChunkMetaIt, FileId.Id, Cm);
  }
  idx2_Assert(ChunkMetaIt);
  chunk_meta_info* ChunkMeta = ChunkMetaIt.Val;
  GrowToAccomodate(&ChunkMeta->Sizes, 4);
  // Write the size of the chunk stream
  WriteVarByte(&ChunkMeta->Sizes, Size(E->ChunkStream));
  u64 ChunkAddress = GetChunkAddress(Idx2, C->LastBrick, Level, Subband, BitPlane);
  PushBack(&ChunkMeta->Addrs, ChunkAddress);
  Rewind(&E->ChunkStream);
}